

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O0

UINT8 device_start_segapcm(SEGAPCM_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  void *pvVar1;
  segapcm_state *spcm;
  DEV_INFO *retDevInf_local;
  SEGAPCM_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x48);
  *(UINT8 *)&((DEV_DATA *)((long)devData.chipInf + 0x30))->chipInf = cfg->bnkshift;
  *(UINT8 *)((long)devData.chipInf + 0x32) = cfg->bnkmask;
  if (*(char *)((long)devData.chipInf + 0x32) == '\0') {
    *(undefined1 *)((long)devData.chipInf + 0x32) = 0x70;
  }
  *(byte *)((long)devData.chipInf + 0x31) =
       *(byte *)((long)devData.chipInf + 0x32) &
       (byte)(0x1fffff >> (*(byte *)&((DEV_DATA *)((long)devData.chipInf + 0x30))->chipInf & 0x1f));
  *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0x20))->chipInf = 0;
  ((DEV_DATA *)((long)devData.chipInf + 0x28))->chipInf = (void *)0x0;
  pvVar1 = malloc(0x800);
  ((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = pvVar1;
  sega_pcm_alloc_rom(devData.chipInf,0x80000);
  segapcm_set_mute_mask(devData.chipInf,0);
  *(void **)devData.chipInf = devData.chipInf;
  INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,(cfg->_genCfg).clock >> 7,&devDef);
  return '\0';
}

Assistant:

static UINT8 device_start_segapcm(const SEGAPCM_CFG* cfg, DEV_INFO* retDevInf)
{
	static const UINT32 STD_ROM_SIZE = 0x80000;
	segapcm_state *spcm;
	
	spcm = (segapcm_state *)calloc(1, sizeof(segapcm_state));
	spcm->bankshift = cfg->bnkshift;
	spcm->intf_mask = cfg->bnkmask;
	if (! spcm->intf_mask)
		spcm->intf_mask = SEGAPCM_BANK_MASK7;
	spcm->bankmask = spcm->intf_mask & (0x1fffff >> spcm->bankshift);
	
	spcm->ROMSize = 0;
	spcm->rom = NULL;
#ifdef _DEBUG
	spcm->romusage = NULL;
#endif
	spcm->ram = (UINT8*)malloc(0x800);
	// RAM clear is done at device_reset
	
	sega_pcm_alloc_rom(spcm, STD_ROM_SIZE);
	
	segapcm_set_mute_mask(spcm, 0x0000);
	
	spcm->_devData.chipInf = spcm;
	INIT_DEVINF(retDevInf, &spcm->_devData, cfg->_genCfg.clock / 128, &devDef);
	return 0x00;
}